

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

bool __thiscall QPDF::findHeader(QPDF *this)

{
  bool bVar1;
  int iVar2;
  long global_offset;
  OffsetInputSource *this_00;
  logic_error *this_01;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> _Stack_98;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_88;
  string version;
  pointer local_58;
  string line;
  
  global_offset =
       (**(code **)(**(long **)&(((this->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file
                                ).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> + 0x20
                   ))();
  InputSource::readLine_abi_cxx11_
            (&line,(((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                   super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x400);
  iVar2 = strncmp(line._M_dataplus._M_p,"%PDF-",5);
  if (iVar2 == 0) {
    local_58 = line._M_dataplus._M_p + 5;
    version._M_dataplus._M_p = (pointer)&version.field_2;
    version._M_string_length = 0;
    version.field_2._M_local_buf[0] = '\0';
    bVar1 = validatePDFVersion(&local_58,&version);
    if (bVar1) {
      std::__cxx11::string::_M_assign
                ((string *)
                 &((this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pdf_version);
      if (global_offset != 0) {
        this_00 = (OffsetInputSource *)operator_new(200);
        std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&_Stack_98,
                   &(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
        OffsetInputSource::OffsetInputSource
                  (this_00,(shared_ptr<InputSource> *)&_Stack_98,global_offset);
        std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<OffsetInputSource,void>
                  ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&local_88,this_00);
        std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,&local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
      }
    }
    std::__cxx11::string::~string((string *)&version);
    std::__cxx11::string::~string((string *)&line);
    return bVar1;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"findHeader is not looking at %PDF-");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool
QPDF::findHeader()
{
    qpdf_offset_t global_offset = m->file->tell();
    std::string line = m->file->readLine(1024);
    char const* p = line.c_str();
    if (strncmp(p, "%PDF-", 5) != 0) {
        throw std::logic_error("findHeader is not looking at %PDF-");
    }
    p += 5;
    std::string version;
    // Note: The string returned by line.c_str() is always null-terminated. The code below never
    // overruns the buffer because a null character always short-circuits further advancement.
    bool valid = validatePDFVersion(p, version);
    if (valid) {
        m->pdf_version = version;
        if (global_offset != 0) {
            // Empirical evidence strongly suggests that when there is leading material prior to the
            // PDF header, all explicit offsets in the file are such that 0 points to the beginning
            // of the header.
            QTC::TC("qpdf", "QPDF global offset");
            m->file = std::shared_ptr<InputSource>(new OffsetInputSource(m->file, global_offset));
        }
    }
    return valid;
}